

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Minesweeper.cpp
# Opt level: O2

void __thiscall
minesweeper::MinefieldGenerator::UpdateCell
          (MinefieldGenerator *this,uint16_t i,uint16_t j,string *data)

{
  int iVar1;
  undefined6 in_register_00000012;
  undefined6 in_register_00000032;
  int iVar2;
  int iVar3;
  
  iVar1 = (int)CONCAT62(in_register_00000012,j);
  if ((data->_M_dataplus)._M_p
      [(CONCAT62(in_register_00000032,i) & 0xffffffff) + (ulong)((uint)this->m_width * iVar1)] ==
      '*') {
    for (iVar2 = iVar1 + -1; iVar2 != iVar1 + 2; iVar2 = iVar2 + 1) {
      for (iVar3 = 0; iVar3 != 3; iVar3 = iVar3 + 1) {
        TryIncrement(this,(char)iVar3 + (char)i + -1,(int8_t)iVar2,data);
      }
    }
  }
  return;
}

Assistant:

void UpdateCell(std::uint16_t i, std::uint16_t j, std::string& data) const
		{
			if ( data[i + j * m_width] == '*' )
				for (auto b = j - 1; b <= j + 1; ++b)
					for (auto a = i - 1; a <= i + 1; ++a)
						TryIncrement(a, b, data);
		}